

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O3

void __thiscall
chaiscript::dispatch::
Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_&)>
::Dynamic_Proxy_Function_Impl
          (Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_&)>
           *this,_func_Boxed_Value_vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_ptr
                 *t_f,int t_arity,AST_NodePtr *t_parsenode,Param_Types *t_param_types,
          string *t_description,Proxy_Function *t_guard)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  type_info *ptVar2;
  AST_NodePtr local_98;
  string local_88;
  Proxy_Function local_68;
  Param_Types local_58;
  
  local_98.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (t_parsenode->super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_98.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (t_parsenode->super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  (t_parsenode->super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (t_parsenode->super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_58.m_types.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (t_param_types->m_types).
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_58.m_types.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (t_param_types->m_types).
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58.m_types.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (t_param_types->m_types).
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (t_param_types->m_types).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (t_param_types->m_types).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (t_param_types->m_types).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.m_has_types = t_param_types->m_has_types;
  local_58._25_7_ = *(undefined7 *)&t_param_types->field_0x19;
  ptVar2 = (t_param_types->m_doti).m_type_info;
  local_58.m_doti._12_8_ = *(undefined8 *)((long)&(t_param_types->m_doti).m_bare_type_info + 4);
  local_58.m_doti.m_bare_type_info._0_4_ =
       (undefined4)((ulong)*(undefined8 *)((long)&(t_param_types->m_doti).m_type_info + 4) >> 0x20);
  local_58.m_doti.m_type_info._0_4_ = SUB84(ptVar2,0);
  local_58.m_doti.m_type_info._4_4_ = (undefined4)((ulong)ptVar2 >> 0x20);
  local_88._M_dataplus._M_p = (t_description->_M_dataplus)._M_p;
  paVar1 = &t_description->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == paVar1) {
    local_88.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_88.field_2._8_8_ = *(undefined8 *)((long)&t_description->field_2 + 8);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_88._M_string_length = t_description->_M_string_length;
  (t_description->_M_dataplus)._M_p = (pointer)paVar1;
  t_description->_M_string_length = 0;
  (t_description->field_2)._M_local_buf[0] = '\0';
  local_68.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (t_guard->
            super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  local_68.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (t_guard->
       super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  (t_guard->
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (t_guard->
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
       = (element_type *)0x0;
  Dynamic_Proxy_Function::Dynamic_Proxy_Function
            (&this->super_Dynamic_Proxy_Function,t_arity,&local_98,&local_58,&local_88,&local_68);
  if (local_68.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ::~vector(&local_58.m_types);
  if (local_98.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_Dynamic_Proxy_Function).super_Proxy_Function_Base._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Dynamic_Proxy_Function_00317e58;
  this->m_f = t_f;
  return;
}

Assistant:

Dynamic_Proxy_Function_Impl(
            Callable t_f, 
            int t_arity=-1,
            AST_NodePtr t_parsenode = AST_NodePtr(),
            Param_Types t_param_types = Param_Types(),
            std::string t_description = "",
            Proxy_Function t_guard = Proxy_Function())
          : Dynamic_Proxy_Function(
                t_arity,
                std::move(t_parsenode),
                std::move(t_param_types),
                std::move(t_description),
                std::move(t_guard)
              ),
            m_f(std::move(t_f))
        {
        }